

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_16781328,_true,_embree::avx512::VirtualCurveIntersectorK<8>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  byte bVar1;
  BVH *bvh;
  size_t sVar2;
  void *pvVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  byte bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  char cVar32;
  byte bVar33;
  bool bVar34;
  int iVar35;
  AABBNodeMB4D *node1;
  undefined4 uVar36;
  uint uVar37;
  ulong uVar38;
  ulong *puVar39;
  long lVar40;
  NodeRef root;
  uint uVar41;
  undefined1 (*pauVar42) [32];
  byte bVar43;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar48 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar49 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar50 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 in_ZMM4 [64];
  float fVar82;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar83 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  vfloat4 a0;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [32];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 in_ZMM28 [64];
  undefined1 auVar115 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [64];
  undefined1 auVar118 [64];
  TravRayK<8,_true> tray;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  byte local_29e4;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2980;
  undefined1 local_2920 [32];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  undefined4 uStack_2884;
  undefined1 local_2880 [8];
  float fStack_2878;
  float fStack_2874;
  float fStack_2870;
  float fStack_286c;
  float fStack_2868;
  undefined4 uStack_2864;
  undefined1 local_2860 [32];
  uint local_2840;
  uint uStack_283c;
  uint uStack_2838;
  uint uStack_2834;
  uint uStack_2830;
  uint uStack_282c;
  uint uStack_2828;
  uint uStack_2824;
  uint local_2820;
  uint uStack_281c;
  uint uStack_2818;
  uint uStack_2814;
  uint uStack_2810;
  uint uStack_280c;
  uint uStack_2808;
  uint uStack_2804;
  uint local_2800;
  uint uStack_27fc;
  uint uStack_27f8;
  uint uStack_27f4;
  uint uStack_27f0;
  uint uStack_27ec;
  uint uStack_27e8;
  uint uStack_27e4;
  undefined1 local_27e0 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_27c0;
  undefined1 local_27a0 [16];
  undefined1 auStack_2790 [16];
  undefined1 auStack_2780 [368];
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  uint local_1e60;
  uint uStack_1e5c;
  uint uStack_1e58;
  uint uStack_1e54;
  uint uStack_1e50;
  uint uStack_1e4c;
  uint uStack_1e48;
  uint uStack_1e44;
  undefined1 local_1e40 [7696];
  int iVar47;
  int iVar69;
  int iVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  
  bvh = (BVH *)This->ptr;
  sVar2 = (bvh->root).ptr;
  if (sVar2 != 8) {
    auVar56 = *(undefined1 (*) [32])(ray + 0x100);
    auVar52 = vpcmpeqd_avx2(in_ZMM1._0_32_,in_ZMM1._0_32_);
    uVar44 = vcmpps_avx512vl(auVar56,ZEXT1632(ZEXT816(0) << 0x40),5);
    uVar38 = vpcmpeqd_avx512vl(auVar52,(undefined1  [32])valid_i->field_0);
    uVar44 = uVar44 & uVar38;
    bVar43 = (byte)uVar44;
    if (bVar43 != 0) {
      local_2920 = *(undefined1 (*) [32])(ray + 0x80);
      local_2900 = *(undefined1 (*) [32])(ray + 0xa0);
      local_28e0 = *(undefined1 (*) [32])(ray + 0xc0);
      auVar106._0_4_ = local_28e0._0_4_ * local_28e0._0_4_;
      auVar106._4_4_ = local_28e0._4_4_ * local_28e0._4_4_;
      auVar106._8_4_ = local_28e0._8_4_ * local_28e0._8_4_;
      auVar106._12_4_ = local_28e0._12_4_ * local_28e0._12_4_;
      auVar106._16_4_ = local_28e0._16_4_ * local_28e0._16_4_;
      auVar106._20_4_ = local_28e0._20_4_ * local_28e0._20_4_;
      auVar106._28_36_ = in_ZMM4._28_36_;
      auVar106._24_4_ = local_28e0._24_4_ * local_28e0._24_4_;
      auVar50 = vfmadd231ps_fma(auVar106._0_32_,local_2900,local_2900);
      auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),local_2920,local_2920);
      auVar51 = vrsqrt14ps_avx512vl(ZEXT1632(auVar50));
      auVar52._8_4_ = 0xbf000000;
      auVar52._0_8_ = 0xbf000000bf000000;
      auVar52._12_4_ = 0xbf000000;
      auVar52._16_4_ = 0xbf000000;
      auVar52._20_4_ = 0xbf000000;
      auVar52._24_4_ = 0xbf000000;
      auVar52._28_4_ = 0xbf000000;
      auVar52 = vmulps_avx512vl(ZEXT1632(auVar50),auVar52);
      fVar82 = auVar51._0_4_;
      fVar86 = auVar51._4_4_;
      fVar87 = auVar51._8_4_;
      fVar88 = auVar51._12_4_;
      fVar89 = auVar51._16_4_;
      fVar90 = auVar51._20_4_;
      fVar91 = auVar51._24_4_;
      auVar50._0_4_ = fVar82 * fVar82;
      auVar50._4_4_ = fVar86 * fVar86;
      auVar50._8_4_ = fVar87 * fVar87;
      auVar50._12_4_ = fVar88 * fVar88;
      auVar54._4_4_ = auVar50._4_4_ * fVar86 * auVar52._4_4_;
      auVar54._0_4_ = auVar50._0_4_ * fVar82 * auVar52._0_4_;
      auVar54._8_4_ = auVar50._8_4_ * fVar87 * auVar52._8_4_;
      auVar54._12_4_ = auVar50._12_4_ * fVar88 * auVar52._12_4_;
      auVar54._16_4_ = fVar89 * fVar89 * fVar89 * auVar52._16_4_;
      auVar54._20_4_ = fVar90 * fVar90 * fVar90 * auVar52._20_4_;
      auVar54._24_4_ = fVar91 * fVar91 * fVar91 * auVar52._24_4_;
      auVar54._28_4_ = auVar52._28_4_;
      auVar53._8_4_ = 0x3fc00000;
      auVar53._0_8_ = 0x3fc000003fc00000;
      auVar53._12_4_ = 0x3fc00000;
      auVar53._16_4_ = 0x3fc00000;
      auVar53._20_4_ = 0x3fc00000;
      auVar53._24_4_ = 0x3fc00000;
      auVar53._28_4_ = 0x3fc00000;
      local_27c0 = (anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1)
                   vfmadd231ps_avx512vl(auVar54,auVar51,auVar53);
      auVar79._8_4_ = 0x80000000;
      auVar79._0_8_ = 0x8000000080000000;
      auVar79._12_4_ = 0x80000000;
      auVar83._12_4_ = 0;
      auVar83._0_12_ = ZEXT812(0);
      auVar83 = auVar83 << 0x20;
      auVar50 = vpcmpeqd_avx(auVar50,auVar50);
      uVar38 = uVar44;
      do {
        lVar40 = 0;
        for (uVar46 = uVar38; (uVar46 & 1) == 0; uVar46 = uVar46 >> 1 | 0x8000000000000000) {
          lVar40 = lVar40 + 1;
        }
        uVar46 = (ulong)(uint)((int)lVar40 * 4);
        auVar48 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar46 + 0x80)),
                                ZEXT416(*(uint *)(ray + uVar46 + 0xa0)),0x1c);
        fVar82 = *(float *)((long)&local_27c0 + uVar46);
        auVar48 = vinsertps_avx(auVar48,ZEXT416(*(uint *)(ray + uVar46 + 0xc0)),0x28);
        auVar97._0_4_ = auVar48._0_4_ * fVar82;
        auVar97._4_4_ = auVar48._4_4_ * fVar82;
        auVar97._8_4_ = auVar48._8_4_ * fVar82;
        auVar97._12_4_ = auVar48._12_4_ * fVar82;
        auVar48 = vshufpd_avx(auVar97,auVar97,1);
        auVar98 = vmovshdup_avx(auVar97);
        auVar99 = vunpckhps_avx(auVar97,auVar83);
        auVar49._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
        auVar49._8_8_ = auVar48._8_8_ ^ auVar79._8_8_;
        auVar49 = vinsertps_avx(auVar49,auVar97,0x2a);
        auVar48 = vdpps_avx(auVar49,auVar49,0x7f);
        auVar99 = vshufps_avx(auVar99,ZEXT416(auVar98._0_4_ ^ 0x80000000),0x41);
        auVar98 = vdpps_avx(auVar99,auVar99,0x7f);
        uVar9 = vcmpps_avx512vl(auVar48,auVar98,1);
        auVar48 = vpmovm2d_avx512vl(uVar9);
        auVar103._0_4_ = auVar48._0_4_;
        auVar103._4_4_ = auVar103._0_4_;
        auVar103._8_4_ = auVar103._0_4_;
        auVar103._12_4_ = auVar103._0_4_;
        uVar46 = vpmovd2m_avx512vl(auVar103);
        auVar48._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar50._4_4_;
        auVar48._0_4_ = (uint)((byte)uVar46 & 1) * auVar50._0_4_;
        auVar48._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar50._8_4_;
        auVar48._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar50._12_4_;
        auVar48 = vblendvps_avx(auVar49,auVar99,auVar48);
        auVar98 = vdpps_avx(auVar48,auVar48,0x7f);
        auVar49 = vrsqrt14ss_avx512f(auVar83,ZEXT416((uint)auVar98._0_4_));
        fVar86 = auVar49._0_4_;
        fVar86 = fVar86 * 1.5 - auVar98._0_4_ * 0.5 * fVar86 * fVar86 * fVar86;
        auVar99._0_4_ = auVar48._0_4_ * fVar86;
        auVar99._4_4_ = auVar48._4_4_ * fVar86;
        auVar99._8_4_ = auVar48._8_4_ * fVar86;
        auVar99._12_4_ = auVar48._12_4_ * fVar86;
        auVar48 = vshufps_avx(auVar99,auVar99,0xc9);
        auVar98 = vshufps_avx(auVar97,auVar97,0xc9);
        auVar104._0_4_ = auVar99._0_4_ * auVar98._0_4_;
        auVar104._4_4_ = auVar99._4_4_ * auVar98._4_4_;
        auVar104._8_4_ = auVar99._8_4_ * auVar98._8_4_;
        auVar104._12_4_ = auVar99._12_4_ * auVar98._12_4_;
        auVar48 = vfmsub231ps_fma(auVar104,auVar97,auVar48);
        lVar40 = lVar40 * 0x30;
        auVar98 = vshufps_avx(auVar48,auVar48,0xc9);
        auVar48 = vdpps_avx(auVar98,auVar98,0x7f);
        uVar38 = uVar38 - 1 & uVar38;
        auVar49 = vrsqrt14ss_avx512f(auVar83,ZEXT416((uint)auVar48._0_4_));
        fVar86 = auVar49._0_4_;
        auVar110 = ZEXT464((uint)(fVar86 * fVar86));
        auVar108 = ZEXT464((uint)(fVar86 * 1.5));
        fVar86 = fVar86 * 1.5 - auVar48._0_4_ * 0.5 * fVar86 * fVar86 * fVar86;
        auVar106 = ZEXT1664(CONCAT412(fVar86,CONCAT48(fVar86,CONCAT44(fVar86,fVar86))));
        auVar101._0_4_ = fVar86 * auVar98._0_4_;
        auVar101._4_4_ = fVar86 * auVar98._4_4_;
        auVar101._8_4_ = fVar86 * auVar98._8_4_;
        auVar101._12_4_ = fVar86 * auVar98._12_4_;
        auVar98._0_4_ = fVar82 * auVar97._0_4_;
        auVar98._4_4_ = fVar82 * auVar97._4_4_;
        auVar98._8_4_ = fVar82 * auVar97._8_4_;
        auVar98._12_4_ = fVar82 * auVar97._12_4_;
        auVar49 = vunpcklps_avx(auVar99,auVar98);
        auVar48 = vunpckhps_avx(auVar99,auVar98);
        auVar99 = vunpcklps_avx(auVar101,auVar83);
        auVar98 = vunpckhps_avx(auVar101,auVar83);
        auVar98 = vunpcklps_avx(auVar48,auVar98);
        auVar97 = vunpcklps_avx(auVar49,auVar99);
        auVar48 = vunpckhps_avx(auVar49,auVar99);
        *(undefined1 (*) [16])(local_27a0 + lVar40) = auVar97;
        *(undefined1 (*) [16])(auStack_2790 + lVar40) = auVar48;
        *(undefined1 (*) [16])(auStack_2780 + lVar40) = auVar98;
      } while (uVar38 != 0);
      local_2980._0_8_ = *(undefined8 *)ray;
      local_2980._8_8_ = *(undefined8 *)(ray + 8);
      local_2980._16_8_ = *(undefined8 *)(ray + 0x10);
      local_2980._24_8_ = *(undefined8 *)(ray + 0x18);
      local_2980._32_8_ = *(undefined8 *)(ray + 0x20);
      local_2980._40_8_ = *(undefined8 *)(ray + 0x28);
      local_2980._48_8_ = *(undefined8 *)(ray + 0x30);
      local_2980._56_8_ = *(undefined8 *)(ray + 0x38);
      local_2980._64_8_ = *(undefined8 *)(ray + 0x40);
      local_2980._72_8_ = *(undefined8 *)(ray + 0x48);
      local_2980._80_8_ = *(undefined8 *)(ray + 0x50);
      local_2980._88_8_ = *(undefined8 *)(ray + 0x58);
      auVar57._8_4_ = 0x7fffffff;
      auVar57._0_8_ = 0x7fffffff7fffffff;
      auVar57._12_4_ = 0x7fffffff;
      auVar57._16_4_ = 0x7fffffff;
      auVar57._20_4_ = 0x7fffffff;
      auVar57._24_4_ = 0x7fffffff;
      auVar57._28_4_ = 0x7fffffff;
      auVar52 = vandps_avx(local_2920,auVar57);
      auVar53 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      auVar113 = ZEXT3264(auVar53);
      uVar38 = vcmpps_avx512vl(auVar52,auVar53,1);
      auVar54 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar114 = ZEXT3264(auVar54);
      auVar51 = vdivps_avx512vl(auVar54,local_2920);
      auVar52 = vandps_avx(local_2900,auVar57);
      uVar46 = vcmpps_avx512vl(auVar52,auVar53,1);
      auVar55 = vdivps_avx512vl(auVar54,local_2900);
      auVar52 = vandps_avx(local_28e0,auVar57);
      uVar45 = vcmpps_avx512vl(auVar52,auVar53,1);
      auVar52 = vdivps_avx512vl(auVar54,local_28e0);
      bVar34 = (bool)((byte)uVar38 & 1);
      local_28c0._0_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar51._0_4_;
      bVar34 = (bool)((byte)(uVar38 >> 1) & 1);
      local_28c0._4_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar51._4_4_;
      bVar34 = (bool)((byte)(uVar38 >> 2) & 1);
      local_28c0._8_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar51._8_4_;
      bVar34 = (bool)((byte)(uVar38 >> 3) & 1);
      local_28c0._12_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar51._12_4_;
      bVar34 = (bool)((byte)(uVar38 >> 4) & 1);
      local_28c0._16_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar51._16_4_;
      bVar34 = (bool)((byte)(uVar38 >> 5) & 1);
      local_28c0._20_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar51._20_4_;
      bVar34 = (bool)((byte)(uVar38 >> 6) & 1);
      local_28c0._24_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar51._24_4_;
      bVar34 = SUB81(uVar38 >> 7,0);
      local_28c0._28_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar51._28_4_;
      bVar34 = (bool)((byte)uVar46 & 1);
      local_28a0._0_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar55._0_4_;
      bVar34 = (bool)((byte)(uVar46 >> 1) & 1);
      local_28a0._4_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar55._4_4_;
      bVar34 = (bool)((byte)(uVar46 >> 2) & 1);
      fStack_2898 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar55._8_4_);
      bVar34 = (bool)((byte)(uVar46 >> 3) & 1);
      fStack_2894 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar55._12_4_);
      bVar34 = (bool)((byte)(uVar46 >> 4) & 1);
      fStack_2890 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar55._16_4_);
      bVar34 = (bool)((byte)(uVar46 >> 5) & 1);
      fStack_288c = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar55._20_4_);
      bVar34 = (bool)((byte)(uVar46 >> 6) & 1);
      fStack_2888 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar55._24_4_);
      bVar34 = SUB81(uVar46 >> 7,0);
      uStack_2884 = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar55._28_4_;
      bVar34 = (bool)((byte)uVar45 & 1);
      local_2880._0_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar52._0_4_;
      bVar34 = (bool)((byte)(uVar45 >> 1) & 1);
      local_2880._4_4_ = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar52._4_4_;
      bVar34 = (bool)((byte)(uVar45 >> 2) & 1);
      fStack_2878 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar52._8_4_);
      bVar34 = (bool)((byte)(uVar45 >> 3) & 1);
      fStack_2874 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar52._12_4_);
      bVar34 = (bool)((byte)(uVar45 >> 4) & 1);
      fStack_2870 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar52._16_4_);
      bVar34 = (bool)((byte)(uVar45 >> 5) & 1);
      fStack_286c = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar52._20_4_);
      bVar34 = (bool)((byte)(uVar45 >> 6) & 1);
      fStack_2868 = (float)((uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar52._24_4_);
      bVar34 = SUB81(uVar45 >> 7,0);
      uStack_2864 = (uint)bVar34 * 0x5d5e0b6b | (uint)!bVar34 * auVar52._28_4_;
      auVar50 = vxorps_avx512vl(in_ZMM28._0_16_,in_ZMM28._0_16_);
      auVar115 = ZEXT1664(auVar50);
      uVar38 = vcmpps_avx512vl(local_28c0,ZEXT1632(auVar50),1);
      auVar52 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      local_2860._4_4_ = (uint)((byte)(uVar38 >> 1) & 1) * auVar52._4_4_;
      local_2860._0_4_ = (uint)((byte)uVar38 & 1) * auVar52._0_4_;
      local_2860._8_4_ = (uint)((byte)(uVar38 >> 2) & 1) * auVar52._8_4_;
      local_2860._12_4_ = (uint)((byte)(uVar38 >> 3) & 1) * auVar52._12_4_;
      local_2860._16_4_ = (uint)((byte)(uVar38 >> 4) & 1) * auVar52._16_4_;
      local_2860._20_4_ = (uint)((byte)(uVar38 >> 5) & 1) * auVar52._20_4_;
      local_2860._24_4_ = (uint)((byte)(uVar38 >> 6) & 1) * auVar52._24_4_;
      local_2860._28_4_ = (uint)(byte)(uVar38 >> 7) * auVar52._28_4_;
      uVar38 = vcmpps_avx512vl(_local_28a0,ZEXT1632(auVar50),5);
      auVar52 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar34 = (bool)((byte)uVar38 & 1);
      local_2840 = (uint)bVar34 * auVar52._0_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar38 >> 1) & 1);
      uStack_283c = (uint)bVar34 * auVar52._4_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar38 >> 2) & 1);
      uStack_2838 = (uint)bVar34 * auVar52._8_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar38 >> 3) & 1);
      uStack_2834 = (uint)bVar34 * auVar52._12_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar38 >> 4) & 1);
      uStack_2830 = (uint)bVar34 * auVar52._16_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar38 >> 5) & 1);
      uStack_282c = (uint)bVar34 * auVar52._20_4_ | (uint)!bVar34 * 0x30;
      bVar34 = (bool)((byte)(uVar38 >> 6) & 1);
      uStack_2828 = (uint)bVar34 * auVar52._24_4_ | (uint)!bVar34 * 0x30;
      bVar34 = SUB81(uVar38 >> 7,0);
      uStack_2824 = (uint)bVar34 * auVar52._28_4_ | (uint)!bVar34 * 0x30;
      auVar53 = ZEXT1632(auVar50);
      uVar38 = vcmpps_avx512vl(_local_2880,auVar53,5);
      auVar52 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar34 = (bool)((byte)uVar38 & 1);
      local_2820 = (uint)bVar34 * auVar52._0_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar38 >> 1) & 1);
      uStack_281c = (uint)bVar34 * auVar52._4_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar38 >> 2) & 1);
      uStack_2818 = (uint)bVar34 * auVar52._8_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar38 >> 3) & 1);
      uStack_2814 = (uint)bVar34 * auVar52._12_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar38 >> 4) & 1);
      uStack_2810 = (uint)bVar34 * auVar52._16_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar38 >> 5) & 1);
      uStack_280c = (uint)bVar34 * auVar52._20_4_ | (uint)!bVar34 * 0x50;
      bVar34 = (bool)((byte)(uVar38 >> 6) & 1);
      uStack_2808 = (uint)bVar34 * auVar52._24_4_ | (uint)!bVar34 * 0x50;
      bVar34 = SUB81(uVar38 >> 7,0);
      uStack_2804 = (uint)bVar34 * auVar52._28_4_ | (uint)!bVar34 * 0x50;
      local_1e80 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar116 = ZEXT3264(local_1e80);
      auVar52 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),auVar53);
      local_2800 = (uint)(bVar43 & 1) * auVar52._0_4_ | (uint)!(bool)(bVar43 & 1) * local_1e80._0_4_
      ;
      bVar34 = (bool)((byte)(uVar44 >> 1) & 1);
      uStack_27fc = (uint)bVar34 * auVar52._4_4_ | (uint)!bVar34 * local_1e80._4_4_;
      bVar34 = (bool)((byte)(uVar44 >> 2) & 1);
      uStack_27f8 = (uint)bVar34 * auVar52._8_4_ | (uint)!bVar34 * local_1e80._8_4_;
      bVar34 = (bool)((byte)(uVar44 >> 3) & 1);
      uStack_27f4 = (uint)bVar34 * auVar52._12_4_ | (uint)!bVar34 * local_1e80._12_4_;
      bVar34 = (bool)((byte)(uVar44 >> 4) & 1);
      uStack_27f0 = (uint)bVar34 * auVar52._16_4_ | (uint)!bVar34 * local_1e80._16_4_;
      bVar34 = (bool)((byte)(uVar44 >> 5) & 1);
      uStack_27ec = (uint)bVar34 * auVar52._20_4_ | (uint)!bVar34 * local_1e80._20_4_;
      bVar34 = (bool)((byte)(uVar44 >> 6) & 1);
      uStack_27e8 = (uint)bVar34 * auVar52._24_4_ | (uint)!bVar34 * local_1e80._24_4_;
      bVar34 = SUB81(uVar44 >> 7,0);
      uStack_27e4 = (uint)bVar34 * auVar52._28_4_ | (uint)!bVar34 * local_1e80._28_4_;
      auVar56 = vmaxps_avx512vl(auVar56,auVar53);
      local_27e0._0_4_ = (uint)(bVar43 & 1) * auVar56._0_4_ | (uint)!(bool)(bVar43 & 1) * -0x800000;
      bVar34 = (bool)((byte)(uVar44 >> 1) & 1);
      local_27e0._4_4_ = (uint)bVar34 * auVar56._4_4_ | (uint)!bVar34 * -0x800000;
      bVar34 = (bool)((byte)(uVar44 >> 2) & 1);
      local_27e0._8_4_ = (uint)bVar34 * auVar56._8_4_ | (uint)!bVar34 * -0x800000;
      bVar34 = (bool)((byte)(uVar44 >> 3) & 1);
      local_27e0._12_4_ = (uint)bVar34 * auVar56._12_4_ | (uint)!bVar34 * -0x800000;
      bVar34 = (bool)((byte)(uVar44 >> 4) & 1);
      local_27e0._16_4_ = (uint)bVar34 * auVar56._16_4_ | (uint)!bVar34 * -0x800000;
      bVar34 = (bool)((byte)(uVar44 >> 5) & 1);
      local_27e0._20_4_ = (uint)bVar34 * auVar56._20_4_ | (uint)!bVar34 * -0x800000;
      bVar34 = (bool)((byte)(uVar44 >> 6) & 1);
      local_27e0._24_4_ = (uint)bVar34 * auVar56._24_4_ | (uint)!bVar34 * -0x800000;
      bVar34 = SUB81(uVar44 >> 7,0);
      local_27e0._28_4_ = (uint)bVar34 * auVar56._28_4_ | (uint)!bVar34 * -0x800000;
      local_29e4 = ~bVar43;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar41 = 5;
      }
      else {
        uVar41 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
      }
      puVar39 = local_2600;
      local_2610 = 0xfffffffffffffff8;
      pauVar42 = (undefined1 (*) [32])local_1e40;
      local_2608 = sVar2;
      local_1e60 = local_2800;
      uStack_1e5c = uStack_27fc;
      uStack_1e58 = uStack_27f8;
      uStack_1e54 = uStack_27f4;
      uStack_1e50 = uStack_27f0;
      uStack_1e4c = uStack_27ec;
      uStack_1e48 = uStack_27e8;
      uStack_1e44 = uStack_27e4;
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
      auVar117 = ZEXT3264(auVar56);
      auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
      auVar118 = ZEXT3264(auVar56);
LAB_0070f4b5:
      do {
        do {
          root.ptr = puVar39[-1];
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0070fbd6;
          puVar39 = puVar39 + -1;
          auVar56 = pauVar42[-1];
          auVar112 = ZEXT3264(auVar56);
          pauVar42 = pauVar42 + -1;
          uVar44 = vcmpps_avx512vl(auVar56,local_27e0,1);
        } while ((char)uVar44 == '\0');
        uVar36 = (undefined4)uVar44;
        if (uVar41 < (uint)POPCOUNT(uVar36)) {
LAB_0070f4f3:
          do {
            iVar35 = 4;
            lVar40 = -0x10;
            uVar44 = 8;
            auVar50 = auVar115._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0070fbd6;
              uVar9 = vcmpps_avx512vl(auVar112._0_32_,local_27e0,9);
              if ((char)uVar9 != '\0') {
                if (local_29e4 == 0xff) {
                  bVar33 = 0;
                }
                else {
                  uVar44 = (ulong)(byte)~local_29e4;
                  bVar1 = *(byte *)(root.ptr & 0xfffffffffffffff0);
                  pvVar3 = This->leafIntersector;
                  bVar33 = 0;
                  do {
                    lVar40 = 0;
                    for (uVar38 = uVar44; (uVar38 & 1) == 0;
                        uVar38 = uVar38 >> 1 | 0x8000000000000000) {
                      lVar40 = lVar40 + 1;
                    }
                    auVar106 = ZEXT1664(auVar106._0_16_);
                    auVar108 = ZEXT1664(auVar108._0_16_);
                    auVar110 = ZEXT1664(auVar110._0_16_);
                    cVar32 = (**(code **)((long)pvVar3 + (ulong)bVar1 * 0x40 + 0x28))
                                       (&local_27c0,ray,lVar40,context,
                                        (byte *)(root.ptr & 0xfffffffffffffff0));
                    auVar50 = auVar115._0_16_;
                    bVar23 = (byte)(1 << ((uint)lVar40 & 0x1f));
                    if (cVar32 == '\0') {
                      bVar23 = 0;
                    }
                    bVar33 = bVar33 | bVar23;
                    uVar44 = uVar44 - 1 & uVar44;
                  } while (uVar44 != 0);
                }
                local_29e4 = local_29e4 | bVar33;
                if (local_29e4 == 0xff) {
                  local_29e4 = 0xff;
                  goto LAB_0070fbd6;
                }
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                bVar34 = (bool)(local_29e4 >> 1 & 1);
                bVar4 = (bool)(local_29e4 >> 2 & 1);
                bVar5 = (bool)(local_29e4 >> 3 & 1);
                bVar6 = (bool)(local_29e4 >> 4 & 1);
                bVar7 = (bool)(local_29e4 >> 5 & 1);
                bVar8 = (bool)(local_29e4 >> 6 & 1);
                local_27e0._4_4_ = (uint)bVar34 * auVar56._4_4_ | (uint)!bVar34 * local_27e0._4_4_;
                local_27e0._0_4_ =
                     (uint)(local_29e4 & 1) * auVar56._0_4_ |
                     (uint)!(bool)(local_29e4 & 1) * local_27e0._0_4_;
                local_27e0._8_4_ = (uint)bVar4 * auVar56._8_4_ | (uint)!bVar4 * local_27e0._8_4_;
                local_27e0._12_4_ = (uint)bVar5 * auVar56._12_4_ | (uint)!bVar5 * local_27e0._12_4_;
                local_27e0._16_4_ = (uint)bVar6 * auVar56._16_4_ | (uint)!bVar6 * local_27e0._16_4_;
                local_27e0._20_4_ = (uint)bVar7 * auVar56._20_4_ | (uint)!bVar7 * local_27e0._20_4_;
                local_27e0._24_4_ = (uint)bVar8 * auVar56._24_4_ | (uint)!bVar8 * local_27e0._24_4_;
                local_27e0._28_4_ =
                     (uint)(local_29e4 >> 7) * auVar56._28_4_ |
                     (uint)!(bool)(local_29e4 >> 7) * local_27e0._28_4_;
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
                auVar113 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar114 = ZEXT3264(auVar56);
                auVar50 = vxorps_avx512vl(auVar50,auVar50);
                auVar115 = ZEXT1664(auVar50);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                auVar116 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
                auVar117 = ZEXT3264(auVar56);
                auVar56 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
                auVar118 = ZEXT3264(auVar56);
              }
              goto LAB_0070f4b5;
            }
            uVar38 = root.ptr & 0xfffffffffffffff0;
            uVar37 = (uint)root.ptr & 7;
            auVar56 = auVar116._0_32_;
            do {
              uVar46 = *(ulong *)(uVar38 + 0x20 + lVar40 * 2);
              if (uVar46 == 8) break;
              auVar107._28_36_ = auVar106._28_36_;
              if ((uVar37 == 6) || (uVar37 == 1)) {
                uVar36 = *(undefined4 *)(uVar38 + 0x90 + lVar40);
                auVar77._4_4_ = uVar36;
                auVar77._0_4_ = uVar36;
                auVar77._8_4_ = uVar36;
                auVar77._12_4_ = uVar36;
                auVar77._16_4_ = uVar36;
                auVar77._20_4_ = uVar36;
                auVar77._24_4_ = uVar36;
                auVar77._28_4_ = uVar36;
                auVar52 = *(undefined1 (*) [32])(ray + 0xe0);
                uVar36 = *(undefined4 *)(uVar38 + 0x30 + lVar40);
                auVar51._4_4_ = uVar36;
                auVar51._0_4_ = uVar36;
                auVar51._8_4_ = uVar36;
                auVar51._12_4_ = uVar36;
                auVar51._16_4_ = uVar36;
                auVar51._20_4_ = uVar36;
                auVar51._24_4_ = uVar36;
                auVar51._28_4_ = uVar36;
                auVar53 = vfmadd213ps_avx512vl(auVar77,auVar52,auVar51);
                uVar36 = *(undefined4 *)(uVar38 + 0xb0 + lVar40);
                auVar80._4_4_ = uVar36;
                auVar80._0_4_ = uVar36;
                auVar80._8_4_ = uVar36;
                auVar80._12_4_ = uVar36;
                auVar80._16_4_ = uVar36;
                auVar80._20_4_ = uVar36;
                auVar80._24_4_ = uVar36;
                auVar80._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x50 + lVar40);
                auVar55._4_4_ = uVar36;
                auVar55._0_4_ = uVar36;
                auVar55._8_4_ = uVar36;
                auVar55._12_4_ = uVar36;
                auVar55._16_4_ = uVar36;
                auVar55._20_4_ = uVar36;
                auVar55._24_4_ = uVar36;
                auVar55._28_4_ = uVar36;
                auVar54 = vfmadd213ps_avx512vl(auVar80,auVar52,auVar55);
                uVar36 = *(undefined4 *)(uVar38 + 0xd0 + lVar40);
                auVar84._4_4_ = uVar36;
                auVar84._0_4_ = uVar36;
                auVar84._8_4_ = uVar36;
                auVar84._12_4_ = uVar36;
                auVar84._16_4_ = uVar36;
                auVar84._20_4_ = uVar36;
                auVar84._24_4_ = uVar36;
                auVar84._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x70 + lVar40);
                auVar58._4_4_ = uVar36;
                auVar58._0_4_ = uVar36;
                auVar58._8_4_ = uVar36;
                auVar58._12_4_ = uVar36;
                auVar58._16_4_ = uVar36;
                auVar58._20_4_ = uVar36;
                auVar58._24_4_ = uVar36;
                auVar58._28_4_ = uVar36;
                auVar51 = vfmadd213ps_avx512vl(auVar84,auVar52,auVar58);
                uVar36 = *(undefined4 *)(uVar38 + 0xa0 + lVar40);
                auVar92._4_4_ = uVar36;
                auVar92._0_4_ = uVar36;
                auVar92._8_4_ = uVar36;
                auVar92._12_4_ = uVar36;
                auVar92._16_4_ = uVar36;
                auVar92._20_4_ = uVar36;
                auVar92._24_4_ = uVar36;
                auVar92._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x40 + lVar40);
                auVar59._4_4_ = uVar36;
                auVar59._0_4_ = uVar36;
                auVar59._8_4_ = uVar36;
                auVar59._12_4_ = uVar36;
                auVar59._16_4_ = uVar36;
                auVar59._20_4_ = uVar36;
                auVar59._24_4_ = uVar36;
                auVar59._28_4_ = uVar36;
                auVar55 = vfmadd213ps_avx512vl(auVar92,auVar52,auVar59);
                uVar36 = *(undefined4 *)(uVar38 + 0xc0 + lVar40);
                auVar94._4_4_ = uVar36;
                auVar94._0_4_ = uVar36;
                auVar94._8_4_ = uVar36;
                auVar94._12_4_ = uVar36;
                auVar94._16_4_ = uVar36;
                auVar94._20_4_ = uVar36;
                auVar94._24_4_ = uVar36;
                auVar94._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x60 + lVar40);
                auVar60._4_4_ = uVar36;
                auVar60._0_4_ = uVar36;
                auVar60._8_4_ = uVar36;
                auVar60._12_4_ = uVar36;
                auVar60._16_4_ = uVar36;
                auVar60._20_4_ = uVar36;
                auVar60._24_4_ = uVar36;
                auVar60._28_4_ = uVar36;
                auVar57 = vfmadd213ps_avx512vl(auVar94,auVar52,auVar60);
                uVar36 = *(undefined4 *)(uVar38 + 0xe0 + lVar40);
                auVar96._4_4_ = uVar36;
                auVar96._0_4_ = uVar36;
                auVar96._8_4_ = uVar36;
                auVar96._12_4_ = uVar36;
                auVar96._16_4_ = uVar36;
                auVar96._20_4_ = uVar36;
                auVar96._24_4_ = uVar36;
                auVar96._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x80 + lVar40);
                auVar61._4_4_ = uVar36;
                auVar61._0_4_ = uVar36;
                auVar61._8_4_ = uVar36;
                auVar61._12_4_ = uVar36;
                auVar61._16_4_ = uVar36;
                auVar61._20_4_ = uVar36;
                auVar61._24_4_ = uVar36;
                auVar61._28_4_ = uVar36;
                auVar58 = vfmadd213ps_avx512vl(auVar96,auVar52,auVar61);
                auVar24._8_8_ = local_2980._8_8_;
                auVar24._0_8_ = local_2980._0_8_;
                auVar24._16_8_ = local_2980._16_8_;
                auVar24._24_8_ = local_2980._24_8_;
                auVar26._8_8_ = local_2980._40_8_;
                auVar26._0_8_ = local_2980._32_8_;
                auVar26._16_8_ = local_2980._48_8_;
                auVar26._24_8_ = local_2980._56_8_;
                auVar28._8_8_ = local_2980._72_8_;
                auVar28._0_8_ = local_2980._64_8_;
                auVar28._16_8_ = local_2980._80_8_;
                auVar28._24_8_ = local_2980._88_8_;
                auVar53 = vsubps_avx(auVar53,auVar24);
                auVar107._0_4_ = local_28c0._0_4_ * auVar53._0_4_;
                auVar107._4_4_ = local_28c0._4_4_ * auVar53._4_4_;
                auVar107._8_4_ = local_28c0._8_4_ * auVar53._8_4_;
                auVar107._12_4_ = local_28c0._12_4_ * auVar53._12_4_;
                auVar107._16_4_ = local_28c0._16_4_ * auVar53._16_4_;
                auVar107._20_4_ = local_28c0._20_4_ * auVar53._20_4_;
                auVar107._24_4_ = local_28c0._24_4_ * auVar53._24_4_;
                auVar59 = auVar107._0_32_;
                auVar106 = ZEXT3264(auVar59);
                auVar53 = vsubps_avx(auVar54,auVar26);
                auVar109._0_4_ = auVar53._0_4_ * (float)local_28a0._0_4_;
                auVar109._4_4_ = auVar53._4_4_ * (float)local_28a0._4_4_;
                auVar109._8_4_ = auVar53._8_4_ * fStack_2898;
                auVar109._12_4_ = auVar53._12_4_ * fStack_2894;
                auVar109._16_4_ = auVar53._16_4_ * fStack_2890;
                auVar109._20_4_ = auVar53._20_4_ * fStack_288c;
                auVar109._28_36_ = auVar108._28_36_;
                auVar109._24_4_ = auVar53._24_4_ * fStack_2888;
                auVar60 = auVar109._0_32_;
                auVar108 = ZEXT3264(auVar60);
                auVar53 = vsubps_avx(auVar51,auVar28);
                auVar111._0_4_ = auVar53._0_4_ * (float)local_2880._0_4_;
                auVar111._4_4_ = auVar53._4_4_ * (float)local_2880._4_4_;
                auVar111._8_4_ = auVar53._8_4_ * fStack_2878;
                auVar111._12_4_ = auVar53._12_4_ * fStack_2874;
                auVar111._16_4_ = auVar53._16_4_ * fStack_2870;
                auVar111._20_4_ = auVar53._20_4_ * fStack_286c;
                auVar111._28_36_ = auVar110._28_36_;
                auVar111._24_4_ = auVar53._24_4_ * fStack_2868;
                auVar61 = auVar111._0_32_;
                auVar110 = ZEXT3264(auVar61);
                auVar53 = vsubps_avx(auVar55,auVar24);
                auVar65._4_4_ = local_28c0._4_4_ * auVar53._4_4_;
                auVar65._0_4_ = local_28c0._0_4_ * auVar53._0_4_;
                auVar65._8_4_ = local_28c0._8_4_ * auVar53._8_4_;
                auVar65._12_4_ = local_28c0._12_4_ * auVar53._12_4_;
                auVar65._16_4_ = local_28c0._16_4_ * auVar53._16_4_;
                auVar65._20_4_ = local_28c0._20_4_ * auVar53._20_4_;
                auVar65._24_4_ = local_28c0._24_4_ * auVar53._24_4_;
                auVar65._28_4_ = auVar55._28_4_;
                auVar53 = vsubps_avx(auVar57,auVar26);
                auVar66._4_4_ = auVar53._4_4_ * (float)local_28a0._4_4_;
                auVar66._0_4_ = auVar53._0_4_ * (float)local_28a0._0_4_;
                auVar66._8_4_ = auVar53._8_4_ * fStack_2898;
                auVar66._12_4_ = auVar53._12_4_ * fStack_2894;
                auVar66._16_4_ = auVar53._16_4_ * fStack_2890;
                auVar66._20_4_ = auVar53._20_4_ * fStack_288c;
                auVar66._24_4_ = auVar53._24_4_ * fStack_2888;
                auVar66._28_4_ = uStack_2884;
                auVar53 = vsubps_avx(auVar58,auVar28);
                auVar67._4_4_ = auVar53._4_4_ * (float)local_2880._4_4_;
                auVar67._0_4_ = auVar53._0_4_ * (float)local_2880._0_4_;
                auVar67._8_4_ = auVar53._8_4_ * fStack_2878;
                auVar67._12_4_ = auVar53._12_4_ * fStack_2874;
                auVar67._16_4_ = auVar53._16_4_ * fStack_2870;
                auVar67._20_4_ = auVar53._20_4_ * fStack_286c;
                auVar67._24_4_ = auVar53._24_4_ * fStack_2868;
                auVar67._28_4_ = uStack_2864;
                auVar53 = vpminsd_avx2(auVar59,auVar65);
                auVar54 = vpminsd_avx2(auVar60,auVar66);
                auVar53 = vpmaxsd_avx2(auVar53,auVar54);
                auVar54 = vpminsd_avx2(auVar61,auVar67);
                auVar53 = vpmaxsd_avx2(auVar53,auVar54);
                auVar51 = vmulps_avx512vl(auVar53,auVar117._0_32_);
                auVar53 = vpmaxsd_avx2(auVar59,auVar65);
                auVar54 = vpmaxsd_avx2(auVar60,auVar66);
                auVar54 = vpminsd_avx2(auVar53,auVar54);
                auVar53 = vpmaxsd_avx2(auVar61,auVar67);
                auVar53 = vpminsd_avx2(auVar54,auVar53);
                auVar54 = vmulps_avx512vl(auVar53,auVar118._0_32_);
                auVar30._4_4_ = uStack_27fc;
                auVar30._0_4_ = local_2800;
                auVar30._8_4_ = uStack_27f8;
                auVar30._12_4_ = uStack_27f4;
                auVar30._16_4_ = uStack_27f0;
                auVar30._20_4_ = uStack_27ec;
                auVar30._24_4_ = uStack_27e8;
                auVar30._28_4_ = uStack_27e4;
                auVar53 = vpmaxsd_avx2(auVar51,auVar30);
                auVar54 = vpminsd_avx2(auVar54,local_27e0);
                uVar45 = vcmpps_avx512vl(auVar53,auVar54,2);
                if (uVar37 == 6) {
                  uVar36 = *(undefined4 *)(uVar38 + 0xf0 + lVar40);
                  auVar12._4_4_ = uVar36;
                  auVar12._0_4_ = uVar36;
                  auVar12._8_4_ = uVar36;
                  auVar12._12_4_ = uVar36;
                  auVar12._16_4_ = uVar36;
                  auVar12._20_4_ = uVar36;
                  auVar12._24_4_ = uVar36;
                  auVar12._28_4_ = uVar36;
                  uVar10 = vcmpps_avx512vl(auVar52,auVar12,0xd);
                  uVar36 = *(undefined4 *)(uVar38 + 0x100 + lVar40);
                  auVar13._4_4_ = uVar36;
                  auVar13._0_4_ = uVar36;
                  auVar13._8_4_ = uVar36;
                  auVar13._12_4_ = uVar36;
                  auVar13._16_4_ = uVar36;
                  auVar13._20_4_ = uVar36;
                  auVar13._24_4_ = uVar36;
                  auVar13._28_4_ = uVar36;
                  uVar11 = vcmpps_avx512vl(auVar52,auVar13,1);
                  uVar45 = uVar45 & uVar10 & uVar11;
                }
              }
              else {
                uVar36 = *(undefined4 *)(uVar38 + 0x30 + lVar40);
                auVar95._4_4_ = uVar36;
                auVar95._0_4_ = uVar36;
                auVar95._8_4_ = uVar36;
                auVar95._12_4_ = uVar36;
                auVar95._16_4_ = uVar36;
                auVar95._20_4_ = uVar36;
                auVar95._24_4_ = uVar36;
                auVar95._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x40 + lVar40);
                auVar93._4_4_ = uVar36;
                auVar93._0_4_ = uVar36;
                auVar93._8_4_ = uVar36;
                auVar93._12_4_ = uVar36;
                auVar93._16_4_ = uVar36;
                auVar93._20_4_ = uVar36;
                auVar93._24_4_ = uVar36;
                auVar93._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x50 + lVar40);
                auVar85._4_4_ = uVar36;
                auVar85._0_4_ = uVar36;
                auVar85._8_4_ = uVar36;
                auVar85._12_4_ = uVar36;
                auVar85._16_4_ = uVar36;
                auVar85._20_4_ = uVar36;
                auVar85._24_4_ = uVar36;
                auVar85._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x60 + lVar40);
                auVar105._4_4_ = uVar36;
                auVar105._0_4_ = uVar36;
                auVar105._8_4_ = uVar36;
                auVar105._12_4_ = uVar36;
                auVar105._16_4_ = uVar36;
                auVar105._20_4_ = uVar36;
                auVar105._24_4_ = uVar36;
                auVar105._28_4_ = uVar36;
                auVar106 = ZEXT3264(auVar105);
                uVar36 = *(undefined4 *)(uVar38 + 0x70 + lVar40);
                auVar102._4_4_ = uVar36;
                auVar102._0_4_ = uVar36;
                auVar102._8_4_ = uVar36;
                auVar102._12_4_ = uVar36;
                auVar102._16_4_ = uVar36;
                auVar102._20_4_ = uVar36;
                auVar102._24_4_ = uVar36;
                auVar102._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x80 + lVar40);
                auVar100._4_4_ = uVar36;
                auVar100._0_4_ = uVar36;
                auVar100._8_4_ = uVar36;
                auVar100._12_4_ = uVar36;
                auVar100._16_4_ = uVar36;
                auVar100._20_4_ = uVar36;
                auVar100._24_4_ = uVar36;
                auVar100._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0x90 + lVar40);
                auVar81._4_4_ = uVar36;
                auVar81._0_4_ = uVar36;
                auVar81._8_4_ = uVar36;
                auVar81._12_4_ = uVar36;
                auVar81._16_4_ = uVar36;
                auVar81._20_4_ = uVar36;
                auVar81._24_4_ = uVar36;
                auVar81._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0xa0 + lVar40);
                auVar78._4_4_ = uVar36;
                auVar78._0_4_ = uVar36;
                auVar78._8_4_ = uVar36;
                auVar78._12_4_ = uVar36;
                auVar78._16_4_ = uVar36;
                auVar78._20_4_ = uVar36;
                auVar78._24_4_ = uVar36;
                auVar78._28_4_ = uVar36;
                uVar36 = *(undefined4 *)(uVar38 + 0xb0 + lVar40);
                auVar76._4_4_ = uVar36;
                auVar76._0_4_ = uVar36;
                auVar76._8_4_ = uVar36;
                auVar76._12_4_ = uVar36;
                auVar76._16_4_ = uVar36;
                auVar76._20_4_ = uVar36;
                auVar76._24_4_ = uVar36;
                auVar76._28_4_ = uVar36;
                auVar52 = *(undefined1 (*) [32])(ray + 0xe0);
                auVar66 = auVar114._0_32_;
                auVar53 = vsubps_avx512vl(auVar66,auVar52);
                uVar36 = *(undefined4 *)(uVar38 + 0xf0 + lVar40);
                auVar14._4_4_ = uVar36;
                auVar14._0_4_ = uVar36;
                auVar14._8_4_ = uVar36;
                auVar14._12_4_ = uVar36;
                auVar14._16_4_ = uVar36;
                auVar14._20_4_ = uVar36;
                auVar14._24_4_ = uVar36;
                auVar14._28_4_ = uVar36;
                auVar54 = vmulps_avx512vl(auVar52,auVar14);
                uVar36 = *(undefined4 *)(uVar38 + 0x100 + lVar40);
                auVar15._4_4_ = uVar36;
                auVar15._0_4_ = uVar36;
                auVar15._8_4_ = uVar36;
                auVar15._12_4_ = uVar36;
                auVar15._16_4_ = uVar36;
                auVar15._20_4_ = uVar36;
                auVar15._24_4_ = uVar36;
                auVar15._28_4_ = uVar36;
                auVar51 = vmulps_avx512vl(auVar52,auVar15);
                uVar36 = *(undefined4 *)(uVar38 + 0x110 + lVar40);
                auVar16._4_4_ = uVar36;
                auVar16._0_4_ = uVar36;
                auVar16._8_4_ = uVar36;
                auVar16._12_4_ = uVar36;
                auVar16._16_4_ = uVar36;
                auVar16._20_4_ = uVar36;
                auVar16._24_4_ = uVar36;
                auVar16._28_4_ = uVar36;
                auVar55 = vmulps_avx512vl(auVar52,auVar16);
                auVar59 = auVar115._0_32_;
                auVar54 = vfmadd231ps_avx512vl(auVar54,auVar53,auVar59);
                auVar51 = vfmadd231ps_avx512vl(auVar51,auVar53,auVar59);
                uVar36 = *(undefined4 *)(uVar38 + 0x120 + lVar40);
                auVar17._4_4_ = uVar36;
                auVar17._0_4_ = uVar36;
                auVar17._8_4_ = uVar36;
                auVar17._12_4_ = uVar36;
                auVar17._16_4_ = uVar36;
                auVar17._20_4_ = uVar36;
                auVar17._24_4_ = uVar36;
                auVar17._28_4_ = uVar36;
                auVar57 = vmulps_avx512vl(auVar52,auVar17);
                uVar36 = *(undefined4 *)(uVar38 + 0x130 + lVar40);
                auVar18._4_4_ = uVar36;
                auVar18._0_4_ = uVar36;
                auVar18._8_4_ = uVar36;
                auVar18._12_4_ = uVar36;
                auVar18._16_4_ = uVar36;
                auVar18._20_4_ = uVar36;
                auVar18._24_4_ = uVar36;
                auVar18._28_4_ = uVar36;
                auVar58 = vmulps_avx512vl(auVar52,auVar18);
                uVar36 = *(undefined4 *)(uVar38 + 0x140 + lVar40);
                auVar19._4_4_ = uVar36;
                auVar19._0_4_ = uVar36;
                auVar19._8_4_ = uVar36;
                auVar19._12_4_ = uVar36;
                auVar19._16_4_ = uVar36;
                auVar19._20_4_ = uVar36;
                auVar19._24_4_ = uVar36;
                auVar19._28_4_ = uVar36;
                auVar52 = vmulps_avx512vl(auVar52,auVar19);
                auVar55 = vfmadd231ps_avx512vl(auVar55,auVar53,auVar59);
                auVar57 = vaddps_avx512vl(auVar53,auVar57);
                auVar58 = vaddps_avx512vl(auVar53,auVar58);
                auVar110 = ZEXT3264(auVar58);
                auVar53 = vaddps_avx512vl(auVar53,auVar52);
                auVar108 = ZEXT3264(auVar53);
                auVar25._8_8_ = local_2980._8_8_;
                auVar25._0_8_ = local_2980._0_8_;
                auVar25._16_8_ = local_2980._16_8_;
                auVar25._24_8_ = local_2980._24_8_;
                auVar27._8_8_ = local_2980._40_8_;
                auVar27._0_8_ = local_2980._32_8_;
                auVar27._16_8_ = local_2980._48_8_;
                auVar27._24_8_ = local_2980._56_8_;
                auVar29._8_8_ = local_2980._72_8_;
                auVar29._0_8_ = local_2980._64_8_;
                auVar29._16_8_ = local_2980._80_8_;
                auVar29._24_8_ = local_2980._88_8_;
                auVar52 = vmulps_avx512vl(auVar81,local_28e0);
                auVar59 = vmulps_avx512vl(auVar78,local_28e0);
                auVar60 = vmulps_avx512vl(auVar76,local_28e0);
                auVar52 = vfmadd231ps_avx512vl(auVar52,local_2900,auVar105);
                auVar59 = vfmadd231ps_avx512vl(auVar59,local_2900,auVar102);
                auVar60 = vfmadd231ps_avx512vl(auVar60,auVar100,local_2900);
                auVar52 = vfmadd231ps_avx512vl(auVar52,local_2920,auVar95);
                auVar59 = vfmadd231ps_avx512vl(auVar59,local_2920,auVar93);
                auVar60 = vfmadd231ps_avx512vl(auVar60,auVar85,local_2920);
                auVar61 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                vandps_avx512vl(auVar52,auVar61);
                auVar65 = auVar113._0_32_;
                uVar45 = vcmpps_avx512vl(auVar61,auVar65,1);
                bVar34 = (bool)((byte)uVar45 & 1);
                iVar47 = auVar113._0_4_;
                auVar62._0_4_ = (uint)bVar34 * iVar47 | (uint)!bVar34 * auVar52._0_4_;
                bVar34 = (bool)((byte)(uVar45 >> 1) & 1);
                iVar69 = auVar113._4_4_;
                auVar62._4_4_ = (uint)bVar34 * iVar69 | (uint)!bVar34 * auVar52._4_4_;
                bVar34 = (bool)((byte)(uVar45 >> 2) & 1);
                iVar70 = auVar113._8_4_;
                auVar62._8_4_ = (uint)bVar34 * iVar70 | (uint)!bVar34 * auVar52._8_4_;
                bVar34 = (bool)((byte)(uVar45 >> 3) & 1);
                iVar71 = auVar113._12_4_;
                auVar62._12_4_ = (uint)bVar34 * iVar71 | (uint)!bVar34 * auVar52._12_4_;
                bVar34 = (bool)((byte)(uVar45 >> 4) & 1);
                iVar72 = auVar113._16_4_;
                auVar62._16_4_ = (uint)bVar34 * iVar72 | (uint)!bVar34 * auVar52._16_4_;
                bVar34 = (bool)((byte)(uVar45 >> 5) & 1);
                iVar73 = auVar113._20_4_;
                auVar62._20_4_ = (uint)bVar34 * iVar73 | (uint)!bVar34 * auVar52._20_4_;
                bVar34 = (bool)((byte)(uVar45 >> 6) & 1);
                iVar74 = auVar113._24_4_;
                iVar75 = auVar113._28_4_;
                auVar62._24_4_ = (uint)bVar34 * iVar74 | (uint)!bVar34 * auVar52._24_4_;
                bVar34 = SUB81(uVar45 >> 7,0);
                auVar62._28_4_ = (uint)bVar34 * iVar75 | (uint)!bVar34 * auVar52._28_4_;
                vandps_avx512vl(auVar59,auVar61);
                uVar45 = vcmpps_avx512vl(auVar62,auVar65,1);
                bVar34 = (bool)((byte)uVar45 & 1);
                auVar63._0_4_ = (uint)bVar34 * iVar47 | (uint)!bVar34 * auVar59._0_4_;
                bVar34 = (bool)((byte)(uVar45 >> 1) & 1);
                auVar63._4_4_ = (uint)bVar34 * iVar69 | (uint)!bVar34 * auVar59._4_4_;
                bVar34 = (bool)((byte)(uVar45 >> 2) & 1);
                auVar63._8_4_ = (uint)bVar34 * iVar70 | (uint)!bVar34 * auVar59._8_4_;
                bVar34 = (bool)((byte)(uVar45 >> 3) & 1);
                auVar63._12_4_ = (uint)bVar34 * iVar71 | (uint)!bVar34 * auVar59._12_4_;
                bVar34 = (bool)((byte)(uVar45 >> 4) & 1);
                auVar63._16_4_ = (uint)bVar34 * iVar72 | (uint)!bVar34 * auVar59._16_4_;
                bVar34 = (bool)((byte)(uVar45 >> 5) & 1);
                auVar63._20_4_ = (uint)bVar34 * iVar73 | (uint)!bVar34 * auVar59._20_4_;
                bVar34 = (bool)((byte)(uVar45 >> 6) & 1);
                auVar63._24_4_ = (uint)bVar34 * iVar74 | (uint)!bVar34 * auVar59._24_4_;
                bVar34 = SUB81(uVar45 >> 7,0);
                auVar63._28_4_ = (uint)bVar34 * iVar75 | (uint)!bVar34 * auVar59._28_4_;
                vandps_avx512vl(auVar60,auVar61);
                uVar45 = vcmpps_avx512vl(auVar63,auVar65,1);
                bVar34 = (bool)((byte)uVar45 & 1);
                auVar64._0_4_ = (uint)bVar34 * iVar47 | (uint)!bVar34 * auVar60._0_4_;
                bVar34 = (bool)((byte)(uVar45 >> 1) & 1);
                auVar64._4_4_ = (uint)bVar34 * iVar69 | (uint)!bVar34 * auVar60._4_4_;
                bVar34 = (bool)((byte)(uVar45 >> 2) & 1);
                auVar64._8_4_ = (uint)bVar34 * iVar70 | (uint)!bVar34 * auVar60._8_4_;
                bVar34 = (bool)((byte)(uVar45 >> 3) & 1);
                auVar64._12_4_ = (uint)bVar34 * iVar71 | (uint)!bVar34 * auVar60._12_4_;
                bVar34 = (bool)((byte)(uVar45 >> 4) & 1);
                auVar64._16_4_ = (uint)bVar34 * iVar72 | (uint)!bVar34 * auVar60._16_4_;
                bVar34 = (bool)((byte)(uVar45 >> 5) & 1);
                auVar64._20_4_ = (uint)bVar34 * iVar73 | (uint)!bVar34 * auVar60._20_4_;
                bVar34 = (bool)((byte)(uVar45 >> 6) & 1);
                auVar64._24_4_ = (uint)bVar34 * iVar74 | (uint)!bVar34 * auVar60._24_4_;
                bVar34 = SUB81(uVar45 >> 7,0);
                auVar64._28_4_ = (uint)bVar34 * iVar75 | (uint)!bVar34 * auVar60._28_4_;
                auVar52 = vrcp14ps_avx512vl(auVar62);
                auVar59 = vfnmadd213ps_avx512vl(auVar62,auVar52,auVar66);
                auVar59 = vfmadd132ps_avx512vl(auVar59,auVar52,auVar52);
                auVar52 = vrcp14ps_avx512vl(auVar63);
                auVar60 = vfnmadd213ps_avx512vl(auVar63,auVar52,auVar66);
                auVar60 = vfmadd132ps_avx512vl(auVar60,auVar52,auVar52);
                auVar52 = vrcp14ps_avx512vl(auVar64);
                auVar61 = vfnmadd213ps_avx512vl(auVar64,auVar52,auVar66);
                uVar36 = *(undefined4 *)(uVar38 + 0xc0 + lVar40);
                auVar20._4_4_ = uVar36;
                auVar20._0_4_ = uVar36;
                auVar20._8_4_ = uVar36;
                auVar20._12_4_ = uVar36;
                auVar20._16_4_ = uVar36;
                auVar20._20_4_ = uVar36;
                auVar20._24_4_ = uVar36;
                auVar20._28_4_ = uVar36;
                auVar65 = vfmadd213ps_avx512vl(auVar81,auVar29,auVar20);
                uVar36 = *(undefined4 *)(uVar38 + 0xd0 + lVar40);
                auVar21._4_4_ = uVar36;
                auVar21._0_4_ = uVar36;
                auVar21._8_4_ = uVar36;
                auVar21._12_4_ = uVar36;
                auVar21._16_4_ = uVar36;
                auVar21._20_4_ = uVar36;
                auVar21._24_4_ = uVar36;
                auVar21._28_4_ = uVar36;
                auVar66 = vfmadd213ps_avx512vl(auVar78,auVar29,auVar21);
                uVar36 = *(undefined4 *)(uVar38 + 0xe0 + lVar40);
                auVar22._4_4_ = uVar36;
                auVar22._0_4_ = uVar36;
                auVar22._8_4_ = uVar36;
                auVar22._12_4_ = uVar36;
                auVar22._16_4_ = uVar36;
                auVar22._20_4_ = uVar36;
                auVar22._24_4_ = uVar36;
                auVar22._28_4_ = uVar36;
                auVar67 = vfmadd213ps_avx512vl(auVar76,auVar29,auVar22);
                auVar61 = vfmadd132ps_avx512vl(auVar61,auVar52,auVar52);
                auVar52 = vfmadd231ps_avx512vl(auVar65,auVar27,auVar105);
                auVar65 = vfmadd231ps_avx512vl(auVar66,auVar27,auVar102);
                auVar66 = vfmadd231ps_avx512vl(auVar67,auVar27,auVar100);
                auVar67 = vfmadd231ps_avx512vl(auVar52,auVar25,auVar95);
                auVar65 = vfmadd231ps_avx512vl(auVar65,auVar25,auVar93);
                auVar66 = vfmadd231ps_avx512vl(auVar66,auVar25,auVar85);
                auVar52 = vsubps_avx(auVar54,auVar67);
                auVar54 = vmulps_avx512vl(auVar59,auVar52);
                auVar52 = vsubps_avx(auVar51,auVar65);
                auVar51 = vmulps_avx512vl(auVar60,auVar52);
                auVar52 = vsubps_avx(auVar55,auVar66);
                auVar55 = vmulps_avx512vl(auVar61,auVar52);
                auVar52 = vsubps_avx512vl(auVar57,auVar67);
                auVar57 = vmulps_avx512vl(auVar59,auVar52);
                auVar52 = vsubps_avx(auVar58,auVar65);
                auVar58 = vmulps_avx512vl(auVar60,auVar52);
                auVar52 = vsubps_avx(auVar53,auVar66);
                auVar59 = vmulps_avx512vl(auVar61,auVar52);
                auVar52 = vpminsd_avx2(auVar54,auVar57);
                auVar53 = vpminsd_avx2(auVar51,auVar58);
                auVar52 = vpmaxsd_avx2(auVar52,auVar53);
                auVar53 = vpminsd_avx2(auVar55,auVar59);
                auVar52 = vpmaxsd_avx2(auVar52,auVar53);
                auVar53 = vpmaxsd_avx2(auVar54,auVar57);
                auVar54 = vpmaxsd_avx2(auVar51,auVar58);
                auVar54 = vpminsd_avx2(auVar53,auVar54);
                auVar53 = vpmaxsd_avx2(auVar55,auVar59);
                auVar53 = vpminsd_avx2(auVar54,auVar53);
                auVar51 = vmulps_avx512vl(auVar52,auVar117._0_32_);
                auVar52 = vmulps_avx512vl(auVar53,auVar118._0_32_);
                auVar31._4_4_ = uStack_27fc;
                auVar31._0_4_ = local_2800;
                auVar31._8_4_ = uStack_27f8;
                auVar31._12_4_ = uStack_27f4;
                auVar31._16_4_ = uStack_27f0;
                auVar31._20_4_ = uStack_27ec;
                auVar31._24_4_ = uStack_27e8;
                auVar31._28_4_ = uStack_27e4;
                auVar53 = vpmaxsd_avx2(auVar51,auVar31);
                auVar52 = vpminsd_avx2(auVar52,local_27e0);
                uVar45 = vcmpps_avx512vl(auVar53,auVar52,2);
              }
              uVar10 = vcmpps_avx512vl(local_27e0,auVar112._0_32_,6);
              uVar45 = uVar45 & uVar10;
              uVar10 = uVar44;
              auVar68 = auVar56;
              if ((byte)uVar45 != 0) {
                auVar53 = vblendmps_avx512vl(auVar116._0_32_,auVar51);
                bVar34 = (bool)((byte)uVar45 & 1);
                auVar68._0_4_ = (uint)bVar34 * auVar53._0_4_ | (uint)!bVar34 * auVar52._0_4_;
                bVar34 = (bool)((byte)(uVar45 >> 1) & 1);
                auVar68._4_4_ = (uint)bVar34 * auVar53._4_4_ | (uint)!bVar34 * auVar52._4_4_;
                bVar34 = (bool)((byte)(uVar45 >> 2) & 1);
                auVar68._8_4_ = (uint)bVar34 * auVar53._8_4_ | (uint)!bVar34 * auVar52._8_4_;
                bVar34 = (bool)((byte)(uVar45 >> 3) & 1);
                auVar68._12_4_ = (uint)bVar34 * auVar53._12_4_ | (uint)!bVar34 * auVar52._12_4_;
                bVar34 = (bool)((byte)(uVar45 >> 4) & 1);
                auVar68._16_4_ = (uint)bVar34 * auVar53._16_4_ | (uint)!bVar34 * auVar52._16_4_;
                bVar34 = (bool)((byte)(uVar45 >> 5) & 1);
                auVar68._20_4_ = (uint)bVar34 * auVar53._20_4_ | (uint)!bVar34 * auVar52._20_4_;
                bVar34 = (bool)((byte)(uVar45 >> 6) & 1);
                auVar68._24_4_ = (uint)bVar34 * auVar53._24_4_ | (uint)!bVar34 * auVar52._24_4_;
                bVar34 = SUB81(uVar45 >> 7,0);
                auVar68._28_4_ = (uint)bVar34 * auVar53._28_4_ | (uint)!bVar34 * auVar52._28_4_;
                uVar10 = uVar46;
                if (uVar44 != 8) {
                  *puVar39 = uVar44;
                  puVar39 = puVar39 + 1;
                  *pauVar42 = auVar56;
                  pauVar42 = pauVar42 + 1;
                }
              }
              auVar56 = auVar68;
              uVar44 = uVar10;
              lVar40 = lVar40 + 4;
            } while (lVar40 != 0);
            if (uVar44 == 8) goto LAB_0070f97b;
            uVar9 = vcmpps_avx512vl(auVar56,local_27e0,9);
            auVar112 = ZEXT3264(auVar56);
            root.ptr = uVar44;
          } while ((byte)uVar41 < (byte)POPCOUNT((int)uVar9));
          *puVar39 = uVar44;
          puVar39 = puVar39 + 1;
          *pauVar42 = auVar56;
          pauVar42 = pauVar42 + 1;
        }
        else {
          do {
            sVar2 = 0;
            for (uVar38 = uVar44; (uVar38 & 1) == 0; uVar38 = uVar38 >> 1 | 0x8000000000000000) {
              sVar2 = sVar2 + 1;
            }
            auVar106 = ZEXT1664(auVar106._0_16_);
            auVar108 = ZEXT1664(auVar108._0_16_);
            auVar110 = ZEXT1664(auVar110._0_16_);
            bVar34 = occluded1(This,bvh,root,sVar2,(Precalculations *)&local_27c0,ray,
                               (TravRayK<8,_true> *)&local_2980.field_0,context);
            bVar33 = (byte)(1 << ((uint)sVar2 & 0x1f));
            if (!bVar34) {
              bVar33 = 0;
            }
            local_29e4 = local_29e4 | bVar33;
            uVar44 = uVar44 - 1 & uVar44;
          } while (uVar44 != 0);
          iVar35 = 3;
          if (local_29e4 != 0xff) {
            auVar52 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
            bVar34 = (bool)(local_29e4 >> 1 & 1);
            bVar4 = (bool)(local_29e4 >> 2 & 1);
            bVar5 = (bool)(local_29e4 >> 3 & 1);
            bVar6 = (bool)(local_29e4 >> 4 & 1);
            bVar7 = (bool)(local_29e4 >> 5 & 1);
            bVar8 = (bool)(local_29e4 >> 6 & 1);
            local_27e0._4_4_ = (uint)bVar34 * auVar52._4_4_ | (uint)!bVar34 * local_27e0._4_4_;
            local_27e0._0_4_ =
                 (uint)(local_29e4 & 1) * auVar52._0_4_ |
                 (uint)!(bool)(local_29e4 & 1) * local_27e0._0_4_;
            local_27e0._8_4_ = (uint)bVar4 * auVar52._8_4_ | (uint)!bVar4 * local_27e0._8_4_;
            local_27e0._12_4_ = (uint)bVar5 * auVar52._12_4_ | (uint)!bVar5 * local_27e0._12_4_;
            local_27e0._16_4_ = (uint)bVar6 * auVar52._16_4_ | (uint)!bVar6 * local_27e0._16_4_;
            local_27e0._20_4_ = (uint)bVar7 * auVar52._20_4_ | (uint)!bVar7 * local_27e0._20_4_;
            local_27e0._24_4_ = (uint)bVar8 * auVar52._24_4_ | (uint)!bVar8 * local_27e0._24_4_;
            local_27e0._28_4_ =
                 (uint)(local_29e4 >> 7) * auVar52._28_4_ |
                 (uint)!(bool)(local_29e4 >> 7) * local_27e0._28_4_;
            iVar35 = 2;
          }
          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
          auVar113 = ZEXT3264(auVar52);
          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar114 = ZEXT3264(auVar52);
          auVar50 = vxorps_avx512vl(auVar115._0_16_,auVar115._0_16_);
          auVar115 = ZEXT1664(auVar50);
          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar116 = ZEXT3264(auVar52);
          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f7ffffa));
          auVar117 = ZEXT3264(auVar52);
          auVar52 = vbroadcastss_avx512vl(ZEXT416(0x3f800003));
          auVar118 = ZEXT3264(auVar52);
          auVar112 = ZEXT3264(auVar56);
          if (uVar41 < (uint)POPCOUNT(uVar36)) goto LAB_0070f4f3;
        }
LAB_0070f97b:
      } while (iVar35 != 3);
LAB_0070fbd6:
      local_29e4 = local_29e4 & bVar43;
      bVar34 = (bool)(local_29e4 >> 1 & 1);
      bVar4 = (bool)(local_29e4 >> 2 & 1);
      bVar5 = (bool)(local_29e4 >> 3 & 1);
      bVar6 = (bool)(local_29e4 >> 4 & 1);
      bVar7 = (bool)(local_29e4 >> 5 & 1);
      bVar8 = (bool)(local_29e4 >> 6 & 1);
      *(uint *)(ray + 0x100) =
           (uint)(local_29e4 & 1) * -0x800000 |
           (uint)!(bool)(local_29e4 & 1) * *(int *)(ray + 0x100);
      *(uint *)(ray + 0x104) = (uint)bVar34 * -0x800000 | (uint)!bVar34 * *(int *)(ray + 0x104);
      *(uint *)(ray + 0x108) = (uint)bVar4 * -0x800000 | (uint)!bVar4 * *(int *)(ray + 0x108);
      *(uint *)(ray + 0x10c) = (uint)bVar5 * -0x800000 | (uint)!bVar5 * *(int *)(ray + 0x10c);
      *(uint *)(ray + 0x110) = (uint)bVar6 * -0x800000 | (uint)!bVar6 * *(int *)(ray + 0x110);
      *(uint *)(ray + 0x114) = (uint)bVar7 * -0x800000 | (uint)!bVar7 * *(int *)(ray + 0x114);
      *(uint *)(ray + 0x118) = (uint)bVar8 * -0x800000 | (uint)!bVar8 * *(int *)(ray + 0x118);
      *(uint *)(ray + 0x11c) =
           (uint)(local_29e4 >> 7) * -0x800000 |
           (uint)!(bool)(local_29e4 >> 7) * *(int *)(ray + 0x11c);
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }